

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O1

void __thiscall sf::Shape::update(Shape *this)

{
  VertexBuffer *pVVar1;
  float fVar2;
  float fVar3;
  Vector2f VVar4;
  Color CVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  size_t sVar9;
  Vertex *pVVar10;
  Vertex *pVVar11;
  size_t sVar12;
  VertexArray *pVVar13;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  FloatRect FVar14;
  ulong uVar8;
  
  iVar7 = (*(this->super_Drawable)._vptr_Drawable[3])();
  uVar8 = CONCAT44(extraout_var,iVar7);
  pVVar13 = &this->m_vertices;
  if (uVar8 < 3) {
    VertexArray::resize(pVVar13,0);
    VertexArray::resize(&this->m_outlineVertices,0);
    bVar6 = VertexBuffer::isAvailable();
    if (bVar6) {
      sVar9 = VertexBuffer::getVertexCount(&this->m_verticesBuffer);
      if (sVar9 != 0) {
        VertexBuffer::create(&this->m_verticesBuffer,0);
      }
      sVar9 = VertexBuffer::getVertexCount(&this->m_outlineVerticesBuffer);
      if (sVar9 != 0) {
        VertexBuffer::create(&this->m_outlineVerticesBuffer,0);
        return;
      }
    }
  }
  else {
    VertexArray::resize(pVVar13,uVar8 + 2);
    sVar9 = 0;
    do {
      (*(this->super_Drawable)._vptr_Drawable[4])(this,sVar9);
      sVar9 = sVar9 + 1;
      pVVar10 = VertexArray::operator[](pVVar13,sVar9);
      VVar4.y = extraout_XMM0_Db;
      VVar4.x = extraout_XMM0_Da;
      pVVar10->position = VVar4;
    } while (uVar8 != sVar9);
    pVVar10 = VertexArray::operator[](pVVar13,1);
    pVVar11 = VertexArray::operator[](pVVar13,uVar8 + 1);
    pVVar11->position = pVVar10->position;
    pVVar10 = VertexArray::operator[](pVVar13,1);
    pVVar11 = VertexArray::operator[](pVVar13,0);
    CVar5 = pVVar10->color;
    fVar2 = (pVVar10->texCoords).x;
    pVVar11->position = pVVar10->position;
    pVVar11->color = CVar5;
    (pVVar11->texCoords).x = fVar2;
    (pVVar11->texCoords).y = (pVVar10->texCoords).y;
    FVar14 = VertexArray::getBounds(pVVar13);
    this->m_insideBounds = FVar14;
    fVar2 = (this->m_insideBounds).width;
    fVar3 = (this->m_insideBounds).left;
    pVVar10 = VertexArray::operator[](pVVar13,0);
    (pVVar10->position).x = fVar2 * 0.5 + fVar3;
    fVar2 = (this->m_insideBounds).height;
    fVar3 = (this->m_insideBounds).top;
    pVVar10 = VertexArray::operator[](pVVar13,0);
    (pVVar10->position).y = fVar2 * 0.5 + fVar3;
    updateFillColors(this);
    updateTexCoords(this);
    updateOutline(this);
    bVar6 = VertexBuffer::isAvailable();
    if (bVar6) {
      pVVar1 = &this->m_verticesBuffer;
      sVar9 = VertexBuffer::getVertexCount(pVVar1);
      sVar12 = VertexArray::getVertexCount(pVVar13);
      if (sVar9 != sVar12) {
        sVar9 = VertexArray::getVertexCount(pVVar13);
        VertexBuffer::create(pVVar1,sVar9);
      }
      pVVar10 = VertexArray::operator[](pVVar13,0);
      VertexBuffer::update(pVVar1,pVVar10);
      pVVar1 = &this->m_outlineVerticesBuffer;
      sVar9 = VertexBuffer::getVertexCount(pVVar1);
      pVVar13 = &this->m_outlineVertices;
      sVar12 = VertexArray::getVertexCount(pVVar13);
      if (sVar9 != sVar12) {
        sVar9 = VertexArray::getVertexCount(pVVar13);
        VertexBuffer::create(pVVar1,sVar9);
      }
      sVar9 = VertexArray::getVertexCount(pVVar13);
      if (sVar9 != 0) {
        pVVar10 = VertexArray::operator[](pVVar13,0);
        VertexBuffer::update(pVVar1,pVVar10);
        return;
      }
    }
  }
  return;
}

Assistant:

void Shape::update()
{
    // Get the total number of points of the shape
    std::size_t count = getPointCount();
    if (count < 3)
    {
        m_vertices.resize(0);
        m_outlineVertices.resize(0);

        if (VertexBuffer::isAvailable())
        {
            if (m_verticesBuffer.getVertexCount())
                m_verticesBuffer.create(0);

            if (m_outlineVerticesBuffer.getVertexCount())
                m_outlineVerticesBuffer.create(0);
        }

        return;
    }

    m_vertices.resize(count + 2); // + 2 for center and repeated first point

    // Position
    for (std::size_t i = 0; i < count; ++i)
        m_vertices[i + 1].position = getPoint(i);
    m_vertices[count + 1].position = m_vertices[1].position;

    // Update the bounding rectangle
    m_vertices[0] = m_vertices[1]; // so that the result of getBounds() is correct
    m_insideBounds = m_vertices.getBounds();

    // Compute the center and make it the first vertex
    m_vertices[0].position.x = m_insideBounds.left + m_insideBounds.width / 2;
    m_vertices[0].position.y = m_insideBounds.top + m_insideBounds.height / 2;

    // Color
    updateFillColors();

    // Texture coordinates
    updateTexCoords();

    // Outline
    updateOutline();

    // Update the vertex buffers if they are being used
    if (VertexBuffer::isAvailable())
    {
        if (m_verticesBuffer.getVertexCount() != m_vertices.getVertexCount())
            m_verticesBuffer.create(m_vertices.getVertexCount());

        m_verticesBuffer.update(&m_vertices[0]);

        if (m_outlineVerticesBuffer.getVertexCount() != m_outlineVertices.getVertexCount())
            m_outlineVerticesBuffer.create(m_outlineVertices.getVertexCount());

        if (m_outlineVertices.getVertexCount())
            m_outlineVerticesBuffer.update(&m_outlineVertices[0]);
    }
}